

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

void random_simulation(int64_t k)

{
  long in_RDI;
  int64_t i;
  int32_t randomize;
  int64_t in_stack_00000030;
  int32_t in_stack_0000003c;
  int64_t in_stack_00000040;
  int32_t in_stack_00000084;
  int32_t in_stack_0000017c;
  int64_t in_stack_00000180;
  long local_18;
  
  msg(1,"starting random simulation up to bound %ld",in_RDI);
  initialize_states(in_stack_00000084);
  initialize_inputs(in_stack_00000040,in_stack_0000003c);
  simulate_step(in_stack_00000180,in_stack_0000017c);
  local_18 = 1;
  while (((local_18 <= in_RDI && (constraints_violated < 0)) && (num_unreached_bads != 0))) {
    transition(in_stack_00000030);
    initialize_inputs(in_stack_00000040,in_stack_0000003c);
    simulate_step(in_stack_00000180,in_stack_0000017c);
    local_18 = local_18 + 1;
  }
  if ((print_trace & 1U) != 0) {
    printf(".\n");
    fflush(_stdout);
  }
  report();
  return;
}

Assistant:

static void
random_simulation (int64_t k)
{
  msg (1, "starting random simulation up to bound %" PRId64, k);
  assert (k >= 0);

  const int32_t randomize = 1;

  initialize_states (randomize);
  initialize_inputs (0, randomize);
  simulate_step (0, randomize);

  for (int64_t i = 1; i <= k; i++)
  {
    if (constraints_violated >= 0) break;
    if (!num_unreached_bads) break;
    transition (i);
    initialize_inputs (i, randomize);
    simulate_step (i, randomize);
  }

  if (print_trace) printf (".\n"), fflush (stdout);
  report ();
}